

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adapt.c
# Opt level: O1

REF_STATUS ref_adapt_pass(REF_GRID ref_grid,REF_BOOL *all_done)

{
  uint uVar1;
  REF_INT ngeom;
  REF_BOOL all_done1;
  REF_BOOL all_done0;
  int local_34;
  int local_30;
  int local_2c;
  
  uVar1 = ref_adapt_parameter(ref_grid,&local_2c);
  if (uVar1 == 0) {
    uVar1 = ref_gather_ngeom(ref_grid->node,ref_grid->geom,2,&local_34);
    if (uVar1 == 0) {
      if ((local_34 < 1) || (uVar1 = ref_geom_verify_topo(ref_grid), uVar1 == 0)) {
        uVar1 = ref_gather_tec_movie_frame(ref_grid,"threed pass");
        if (uVar1 == 0) {
          if (1 < ref_grid->adapt->timing_level) {
            ref_mpi_stopwatch_stop(ref_grid->mpi,"adapt start");
          }
          if ((ref_grid->adapt->watch_param == 0) ||
             (uVar1 = ref_adapt_tattle(ref_grid,"start"), uVar1 == 0)) {
            if ((ref_grid->adapt->watch_topo == 0) || (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0)
               ) {
              uVar1 = ref_adapt_swap(ref_grid);
              if (uVar1 == 0) {
                uVar1 = ref_gather_tec_movie_frame(ref_grid,"swap");
                if (uVar1 == 0) {
                  if (1 < ref_grid->adapt->timing_level) {
                    ref_mpi_stopwatch_stop(ref_grid->mpi,"adapt swap");
                  }
                  if ((ref_grid->adapt->watch_param == 0) ||
                     (uVar1 = ref_adapt_tattle(ref_grid,"swap"), uVar1 == 0)) {
                    if ((ref_grid->adapt->watch_topo == 0) ||
                       (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0)) {
                      uVar1 = ref_collapse_pass(ref_grid);
                      if (uVar1 == 0) {
                        uVar1 = ref_gather_tec_movie_frame(ref_grid,"collapse");
                        if (uVar1 == 0) {
                          if (1 < ref_grid->adapt->timing_level) {
                            ref_mpi_stopwatch_stop(ref_grid->mpi,"adapt col");
                          }
                          if ((ref_grid->adapt->watch_param == 0) ||
                             (uVar1 = ref_adapt_tattle(ref_grid,"col"), uVar1 == 0)) {
                            if ((ref_grid->adapt->watch_topo == 0) ||
                               (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0)) {
                              uVar1 = ref_adapt_swap(ref_grid);
                              if (uVar1 == 0) {
                                uVar1 = ref_gather_tec_movie_frame(ref_grid,"swap");
                                if (uVar1 == 0) {
                                  if (1 < ref_grid->adapt->timing_level) {
                                    ref_mpi_stopwatch_stop(ref_grid->mpi,"adapt swap");
                                  }
                                  if ((ref_grid->adapt->watch_param == 0) ||
                                     (uVar1 = ref_adapt_tattle(ref_grid,"swap"), uVar1 == 0)) {
                                    if ((ref_grid->adapt->watch_topo == 0) ||
                                       (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0)) {
                                      ref_grid->adapt->post_max_ratio = 1.4142135623730951;
                                      uVar1 = ref_collapse_pass(ref_grid);
                                      if (uVar1 == 0) {
                                        uVar1 = ref_gather_tec_movie_frame(ref_grid,"collapse");
                                        if (uVar1 == 0) {
                                          if (1 < ref_grid->adapt->timing_level) {
                                            ref_mpi_stopwatch_stop(ref_grid->mpi,"adapt col");
                                          }
                                          if ((ref_grid->adapt->watch_param == 0) ||
                                             (uVar1 = ref_adapt_tattle(ref_grid,"col"), uVar1 == 0))
                                          {
                                            if ((ref_grid->adapt->watch_topo == 0) ||
                                               (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0)) {
                                              ref_grid->adapt->post_max_ratio =
                                                   ref_grid->adapt->last_max_ratio;
                                              uVar1 = ref_adapt_swap(ref_grid);
                                              if (uVar1 == 0) {
                                                uVar1 = ref_gather_tec_movie_frame(ref_grid,"swap");
                                                if (uVar1 == 0) {
                                                  if (1 < ref_grid->adapt->timing_level) {
                                                    ref_mpi_stopwatch_stop
                                                              (ref_grid->mpi,"adapt swap");
                                                  }
                                                  if ((ref_grid->adapt->watch_param == 0) ||
                                                     (uVar1 = ref_adapt_tattle(ref_grid,"swap"),
                                                     uVar1 == 0)) {
                                                    if ((ref_grid->adapt->watch_topo == 0) ||
                                                       (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0
                                                       )) {
                                                      uVar1 = ref_smooth_pass(ref_grid);
                                                      if (uVar1 == 0) {
                                                        uVar1 = ref_gather_tec_movie_frame
                                                                          (ref_grid,"smooth");
                                                        if (uVar1 == 0) {
                                                          if (1 < ref_grid->adapt->timing_level) {
                                                            ref_mpi_stopwatch_stop
                                                                      (ref_grid->mpi,"adapt move");
                                                          }
                                                          if ((ref_grid->adapt->watch_param == 0) ||
                                                             (uVar1 = ref_adapt_tattle(ref_grid,
                                                  "move"), uVar1 == 0)) {
                                                    if ((ref_grid->adapt->watch_topo == 0) ||
                                                       (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0
                                                       )) {
                                                      uVar1 = ref_adapt_swap(ref_grid);
                                                      if (uVar1 == 0) {
                                                        uVar1 = ref_gather_tec_movie_frame
                                                                          (ref_grid,"swap");
                                                        if (uVar1 == 0) {
                                                          if (1 < ref_grid->adapt->timing_level) {
                                                            ref_mpi_stopwatch_stop
                                                                      (ref_grid->mpi,"adapt swap");
                                                          }
                                                          if ((ref_grid->adapt->watch_param == 0) ||
                                                             (uVar1 = ref_adapt_tattle(ref_grid,
                                                  "swap"), uVar1 == 0)) {
                                                    if ((ref_grid->adapt->watch_topo == 0) ||
                                                       (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0
                                                       )) {
                                                      uVar1 = ref_adapt_parameter(ref_grid,&local_30
                                                                                 );
                                                      if (uVar1 == 0) {
                                                        uVar1 = ref_split_pass(ref_grid);
                                                        if (uVar1 == 0) {
                                                          uVar1 = ref_gather_tec_movie_frame
                                                                            (ref_grid,"split");
                                                          if (uVar1 == 0) {
                                                            if (1 < ref_grid->adapt->timing_level) {
                                                              ref_mpi_stopwatch_stop
                                                                        (ref_grid->mpi,"adapt spl");
                                                            }
                                                            if ((ref_grid->adapt->watch_param == 0)
                                                               || (uVar1 = ref_adapt_tattle(ref_grid
                                                  ,"split"), uVar1 == 0)) {
                                                    if ((ref_grid->adapt->watch_topo == 0) ||
                                                       (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0
                                                       )) {
                                                      uVar1 = ref_adapt_swap(ref_grid);
                                                      if (uVar1 == 0) {
                                                        uVar1 = ref_gather_tec_movie_frame
                                                                          (ref_grid,"swap");
                                                        if (uVar1 == 0) {
                                                          if (1 < ref_grid->adapt->timing_level) {
                                                            ref_mpi_stopwatch_stop
                                                                      (ref_grid->mpi,"adapt swap");
                                                          }
                                                          if ((ref_grid->adapt->watch_param == 0) ||
                                                             (uVar1 = ref_adapt_tattle(ref_grid,
                                                  "swap"), uVar1 == 0)) {
                                                    if ((ref_grid->adapt->watch_topo == 0) ||
                                                       (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0
                                                       )) {
                                                      uVar1 = ref_smooth_pass(ref_grid);
                                                      if (uVar1 == 0) {
                                                        uVar1 = ref_gather_tec_movie_frame
                                                                          (ref_grid,"smooth");
                                                        if (uVar1 == 0) {
                                                          if (1 < ref_grid->adapt->timing_level) {
                                                            ref_mpi_stopwatch_stop
                                                                      (ref_grid->mpi,"adapt move");
                                                          }
                                                          if ((ref_grid->adapt->watch_param == 0) ||
                                                             (uVar1 = ref_adapt_tattle(ref_grid,
                                                  "move"), uVar1 == 0)) {
                                                    if ((ref_grid->adapt->watch_topo == 0) ||
                                                       (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0
                                                       )) {
                                                      uVar1 = ref_adapt_swap(ref_grid);
                                                      if (uVar1 == 0) {
                                                        uVar1 = ref_gather_tec_movie_frame
                                                                          (ref_grid,"swap");
                                                        if (uVar1 == 0) {
                                                          if (1 < ref_grid->adapt->timing_level) {
                                                            ref_mpi_stopwatch_stop
                                                                      (ref_grid->mpi,"adapt swap");
                                                          }
                                                          if ((ref_grid->adapt->watch_param == 0) ||
                                                             (uVar1 = ref_adapt_tattle(ref_grid,
                                                  "swap"), uVar1 == 0)) {
                                                    if ((ref_grid->adapt->watch_topo == 0) ||
                                                       (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0
                                                       )) {
                                                      ref_grid->adapt->post_max_ratio =
                                                           1.4142135623730951;
                                                      uVar1 = ref_collapse_pass(ref_grid);
                                                      if (uVar1 == 0) {
                                                        uVar1 = ref_gather_tec_movie_frame
                                                                          (ref_grid,"collapse");
                                                        if (uVar1 == 0) {
                                                          if (1 < ref_grid->adapt->timing_level) {
                                                            ref_mpi_stopwatch_stop
                                                                      (ref_grid->mpi,"adapt col");
                                                          }
                                                          if ((ref_grid->adapt->watch_param == 0) ||
                                                             (uVar1 = ref_adapt_tattle(ref_grid,
                                                  "col"), uVar1 == 0)) {
                                                    if ((ref_grid->adapt->watch_topo == 0) ||
                                                       (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0
                                                       )) {
                                                      ref_grid->adapt->post_max_ratio =
                                                           ref_grid->adapt->last_max_ratio;
                                                      uVar1 = ref_adapt_swap(ref_grid);
                                                      if (uVar1 == 0) {
                                                        uVar1 = ref_gather_tec_movie_frame
                                                                          (ref_grid,"swap");
                                                        if (uVar1 == 0) {
                                                          if (1 < ref_grid->adapt->timing_level) {
                                                            ref_mpi_stopwatch_stop
                                                                      (ref_grid->mpi,"adapt swap");
                                                          }
                                                          if ((ref_grid->adapt->watch_param == 0) ||
                                                             (uVar1 = ref_adapt_tattle(ref_grid,
                                                  "swap"), uVar1 == 0)) {
                                                    if ((ref_grid->adapt->watch_topo == 0) ||
                                                       (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0
                                                       )) {
                                                      uVar1 = ref_smooth_pass(ref_grid);
                                                      if (uVar1 == 0) {
                                                        uVar1 = ref_gather_tec_movie_frame
                                                                          (ref_grid,"smooth");
                                                        if (uVar1 == 0) {
                                                          if (1 < ref_grid->adapt->timing_level) {
                                                            ref_mpi_stopwatch_stop
                                                                      (ref_grid->mpi,"adapt move");
                                                          }
                                                          if ((ref_grid->adapt->watch_param == 0) ||
                                                             (uVar1 = ref_adapt_tattle(ref_grid,
                                                  "move"), uVar1 == 0)) {
                                                    if ((ref_grid->adapt->watch_topo == 0) ||
                                                       (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0
                                                       )) {
                                                      uVar1 = ref_adapt_swap(ref_grid);
                                                      if (uVar1 == 0) {
                                                        uVar1 = ref_gather_tec_movie_frame
                                                                          (ref_grid,"swap");
                                                        if (uVar1 == 0) {
                                                          if (1 < ref_grid->adapt->timing_level) {
                                                            ref_mpi_stopwatch_stop
                                                                      (ref_grid->mpi,"adapt swap");
                                                          }
                                                          if ((ref_grid->adapt->watch_param == 0) ||
                                                             (uVar1 = ref_adapt_tattle(ref_grid,
                                                  "swap"), uVar1 == 0)) {
                                                    if ((ref_grid->adapt->watch_topo == 0) ||
                                                       (uVar1 = ref_adapt_topo(ref_grid), uVar1 == 0
                                                       )) {
                                                      if (ref_grid->adapt->unlock_tet != 0) {
                                                        uVar1 = ref_split_edge_geometry(ref_grid);
                                                        if (uVar1 != 0) {
                                                          printf("%s: %d: %s: %d %s\n",
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x31a,"ref_adapt_pass",(ulong)uVar1,
                                                  "split edge geom");
                                                  return uVar1;
                                                  }
                                                  if (1 < ref_grid->adapt->timing_level) {
                                                    ref_mpi_stopwatch_stop
                                                              (ref_grid->mpi,"adapt unlock");
                                                  }
                                                  }
                                                  uVar1 = ref_adapt_tattle(ref_grid,"adapt");
                                                  if (uVar1 == 0) {
                                                    if ((local_34 < 1) ||
                                                       (uVar1 = ref_geom_verify_topo(ref_grid),
                                                       uVar1 == 0)) {
                                                      *all_done = (uint)(local_30 != 0 &&
                                                                        local_2c != 0);
                                                      uVar1 = 0;
                                                    }
                                                    else {
                                                      printf("%s: %d: %s: %d %s\n",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x322,"ref_adapt_pass",(ulong)uVar1,
                                                  "geom topo postflight check");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,799,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x316,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x314,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x310,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x30f,"ref_adapt_pass",(ulong)uVar1,"swap pass");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x30d,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x30b,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x307,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x306,"ref_adapt_pass",(ulong)uVar1,"smooth pass"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x303,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x301,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2fd,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2fc,"ref_adapt_pass",(ulong)uVar1,"swap pass");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2f7,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2f5,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2f1,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2f0,"ref_adapt_pass",(ulong)uVar1,"col pass");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2eb,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2e9,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2e5,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2e4,"ref_adapt_pass",(ulong)uVar1,"swap pass");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2e2,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2e0,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2dc,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2db,"ref_adapt_pass",(ulong)uVar1,"smooth pass"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2d8,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2d6,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2d2,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2d1,"ref_adapt_pass",(ulong)uVar1,"swap pass");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2cf,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2cd,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2c9,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2c8,"ref_adapt_pass",(ulong)uVar1,
                                                  "split surfpass");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2c6,"ref_adapt_pass",(ulong)uVar1,"param");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2c4,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2c2,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2be,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2bd,"ref_adapt_pass",(ulong)uVar1,"swap pass");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2ba,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2b8,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2b4,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2b3,"ref_adapt_pass",(ulong)uVar1,"smooth pass"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2b1,"ref_adapt_pass",(ulong)uVar1,"topo");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2af,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                                  }
                                                }
                                                else {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2ab,"ref_adapt_pass",(ulong)uVar1,"movie frame"
                                                  );
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2aa,"ref_adapt_pass",(ulong)uVar1,"swap pass");
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2a4,"ref_adapt_pass",(ulong)uVar1,"topo");
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                  ,0x2a2,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                                 ,0x29e,"ref_adapt_pass",(ulong)uVar1,"movie frame")
                                          ;
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                               ,0x29d,"ref_adapt_pass",(ulong)uVar1,"col pass");
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                             ,0x299,"ref_adapt_pass",(ulong)uVar1,"topo");
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                           ,0x297,"ref_adapt_pass",(ulong)uVar1,"tattle");
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                         ,0x293,"ref_adapt_pass",(ulong)uVar1,"movie frame");
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                       ,0x292,"ref_adapt_pass",(ulong)uVar1,"swap pass");
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                     ,0x290,"ref_adapt_pass",(ulong)uVar1,"topo");
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                   ,0x28e,"ref_adapt_pass",(ulong)uVar1,"tattle");
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                                 ,0x28a,"ref_adapt_pass",(ulong)uVar1,"movie frame");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                               ,0x289,"ref_adapt_pass",(ulong)uVar1,"col pass");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                             ,0x287,"ref_adapt_pass",(ulong)uVar1,"topo");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                           ,0x285,"ref_adapt_pass",(ulong)uVar1,"tattle");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                         ,0x281,"ref_adapt_pass",(ulong)uVar1,"movie frame");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                       ,0x280,"ref_adapt_pass",(ulong)uVar1,"swap pass");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                     ,0x27e,"ref_adapt_pass",(ulong)uVar1,"topo");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c"
                   ,0x27c,"ref_adapt_pass",(ulong)uVar1,"tattle");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
                 0x278,"ref_adapt_pass",(ulong)uVar1,"movie frame");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",
               0x276,"ref_adapt_pass",(ulong)uVar1,"adapt preflight check");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x275
             ,"ref_adapt_pass",(ulong)uVar1,"count ngeom");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_adapt.c",0x271,
           "ref_adapt_pass",(ulong)uVar1,"param");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_adapt_pass(REF_GRID ref_grid, REF_BOOL *all_done) {
  REF_INT ngeom;
  REF_BOOL all_done0, all_done1;
  REF_INT i, swap_smooth_passes = 1;

  RSS(ref_adapt_parameter(ref_grid, &all_done0), "param");

  RSS(ref_gather_ngeom(ref_grid_node(ref_grid), ref_grid_geom(ref_grid),
                       REF_GEOM_FACE, &ngeom),
      "count ngeom");
  if (ngeom > 0) RSS(ref_geom_verify_topo(ref_grid), "adapt preflight check");

  ref_gather_blocking_frame(ref_grid, "threed pass");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt start");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "start"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  RSS(ref_adapt_swap(ref_grid), "swap pass");
  ref_gather_blocking_frame(ref_grid, "swap");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  RSS(ref_collapse_pass(ref_grid), "col pass");
  ref_gather_blocking_frame(ref_grid, "collapse");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt col");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "col"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  RSS(ref_adapt_swap(ref_grid), "swap pass");
  ref_gather_blocking_frame(ref_grid, "swap");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  ref_grid_adapt(ref_grid, post_max_ratio) = sqrt(2.0);

  RSS(ref_collapse_pass(ref_grid), "col pass");
  ref_gather_blocking_frame(ref_grid, "collapse");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt col");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "col"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  ref_grid_adapt(ref_grid, post_max_ratio) =
      ref_grid_adapt(ref_grid, last_max_ratio);

  for (i = 0; i < swap_smooth_passes; i++) {
    RSS(ref_adapt_swap(ref_grid), "swap pass");
    ref_gather_blocking_frame(ref_grid, "swap");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");

    RSS(ref_smooth_pass(ref_grid), "smooth pass");
    ref_gather_blocking_frame(ref_grid, "smooth");
    if (ref_grid_adapt(ref_grid, timing_level > 1))
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt move");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "move"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");
  }

  RSS(ref_adapt_swap(ref_grid), "swap pass");
  ref_gather_blocking_frame(ref_grid, "swap");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  RSS(ref_adapt_parameter(ref_grid, &all_done1), "param");

  RSS(ref_split_pass(ref_grid), "split surfpass");
  ref_gather_blocking_frame(ref_grid, "split");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt spl");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "split"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  RSS(ref_adapt_swap(ref_grid), "swap pass");
  ref_gather_blocking_frame(ref_grid, "swap");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  for (i = 0; i < swap_smooth_passes; i++) {
    RSS(ref_smooth_pass(ref_grid), "smooth pass");
    ref_gather_blocking_frame(ref_grid, "smooth");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt move");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "move"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");

    RSS(ref_adapt_swap(ref_grid), "swap pass");
    ref_gather_blocking_frame(ref_grid, "swap");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");
  }

  ref_grid_adapt(ref_grid, post_max_ratio) = sqrt(2.0);

  RSS(ref_collapse_pass(ref_grid), "col pass");
  ref_gather_blocking_frame(ref_grid, "collapse");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt col");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "col"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  ref_grid_adapt(ref_grid, post_max_ratio) =
      ref_grid_adapt(ref_grid, last_max_ratio);

  RSS(ref_adapt_swap(ref_grid), "swap pass");
  ref_gather_blocking_frame(ref_grid, "swap");
  if (ref_grid_adapt(ref_grid, timing_level) > 1)
    ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
  if (ref_grid_adapt(ref_grid, watch_param))
    RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
  if (ref_grid_adapt(ref_grid, watch_topo))
    RSS(ref_adapt_topo(ref_grid), "topo");

  for (i = 0; i < swap_smooth_passes; i++) {
    RSS(ref_smooth_pass(ref_grid), "smooth pass");
    ref_gather_blocking_frame(ref_grid, "smooth");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt move");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "move"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");

    RSS(ref_adapt_swap(ref_grid), "swap pass");
    ref_gather_blocking_frame(ref_grid, "swap");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt swap");
    if (ref_grid_adapt(ref_grid, watch_param))
      RSS(ref_adapt_tattle(ref_grid, "swap"), "tattle");
    if (ref_grid_adapt(ref_grid, watch_topo))
      RSS(ref_adapt_topo(ref_grid), "topo");
  }

  if (ref_grid_adapt(ref_grid, unlock_tet)) {
    RSS(ref_split_edge_geometry(ref_grid), "split edge geom");
    if (ref_grid_adapt(ref_grid, timing_level) > 1)
      ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "adapt unlock");
  }

  RSS(ref_adapt_tattle(ref_grid, "adapt"), "tattle");

  if (ngeom > 0)
    RSS(ref_geom_verify_topo(ref_grid), "geom topo postflight check");

  *all_done = (all_done0 && all_done1);

  return REF_SUCCESS;
}